

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorUtilTest.cpp
# Opt level: O0

void __thiscall jaegertracing::utils::ErrorUtil_test_Test::TestBody(ErrorUtil_test_Test *this)

{
  error_category *__ecat;
  runtime_error *this_00;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int i;
  undefined1 local_208 [8];
  Exception transportEx;
  system_error sysEx;
  runtime_error local_1c0 [8];
  runtime_error stdEx;
  undefined1 local_1b0 [8];
  TestLogger logger;
  ostringstream oss;
  ErrorUtil_test_Test *this_local;
  
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)(logger._message.field_2._M_local_buf + 8));
  anon_unknown_1::TestLogger::TestLogger((TestLogger *)local_1b0);
  std::runtime_error::runtime_error(local_1c0,"runtime error");
  __ecat = (error_category *)std::_V2::generic_category();
  std::system_error::system_error((system_error *)&transportEx._numFailed,-1,__ecat);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i,"test",(allocator *)((long)&gtest_ar.message_.ptr_ + 7))
  ;
  Sender::Exception::Exception((Exception *)local_208,(string *)&i,5);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  gtest_ar.message_.ptr_._0_4_ = 0;
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,local_1c0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TEST(ErrorUtil, test)
{
    std::ostringstream oss;
    TestLogger logger;
    std::runtime_error stdEx("runtime error");
    std::system_error sysEx(-1, std::generic_category());
    Sender::Exception transportEx("test", 5);
    for (auto i = 0; i < 4; ++i) {
        try {
            switch (i) {
            case 0:
                throw stdEx;
            case 1:
                throw sysEx;
            case 2:
                throw transportEx;
            default:
                ASSERT_EQ(3, i);
                throw 5;
            }
        } catch (...) {
            ErrorUtil::logError(logger, "test");
            switch (i) {
            case 0: {
                ASSERT_EQ("test: runtime error", logger.str());
            } break;
            case 1: {
                ASSERT_TRUE(endsWith(logger.str(), ", code=-1"));
            } break;
            case 2: {
                ASSERT_EQ("test: test, numFailed=5", logger.str());
            } break;
            default: {
                ASSERT_EQ(3, i);
                ASSERT_EQ("test", logger.str());
            } break;
            }
        }
    }
}